

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall Js::PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity(PathTypeHandlerBase *this)

{
  bool bVar1;
  ushort newInlineSlotCapacity;
  PathTypeHandlerBase *this_00;
  DynamicType *pDVar2;
  PathTypeHandlerBase *rootTypeHandler;
  uint16 local_1a [4];
  uint16 maxPathLength;
  
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    pDVar2 = (this->predecessorType).ptr;
    this_00 = this;
    while (pDVar2 != (DynamicType *)0x0) {
      this_00 = FromTypeHandler((pDVar2->typeHandler).ptr);
      pDVar2 = (this_00->predecessorType).ptr;
    }
    local_1a[0] = 0;
    bVar1 = GetMaxPathLength(this_00,local_1a);
    if (bVar1) {
      bVar1 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
      if (bVar1) {
        newInlineSlotCapacity =
             DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(local_1a[0]);
      }
      else {
        newInlineSlotCapacity = DynamicTypeHandler::RoundUpInlineSlotCapacity(local_1a[0]);
      }
      if (newInlineSlotCapacity < (this->super_DynamicTypeHandler).inlineSlotCapacity) {
        ShrinkSlotAndInlineSlotCapacity(this_00,newInlineSlotCapacity);
        goto LAB_00dd2dbf;
      }
    }
    (*(this_00->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3e])(this_00);
  }
LAB_00dd2dbf:
  pDVar2 = (this->predecessorType).ptr;
  while (pDVar2 != (DynamicType *)0x0) {
    this = FromTypeHandler((pDVar2->typeHandler).ptr);
    pDVar2 = (this->predecessorType).ptr;
  }
  (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x40])(this);
  return;
}

Assistant:

void PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity()
    {
        if (!GetIsInlineSlotCapacityLocked())
        {
            PathTypeHandlerBase * rootTypeHandler = GetRootPathTypeHandler();

            bool shrunk = false;
            uint16 maxPathLength = 0;
            if (rootTypeHandler->GetMaxPathLength(&maxPathLength))
            {
                uint16 newInlineSlotCapacity =
                    IsObjectHeaderInlinedTypeHandler()
                        ? RoundUpObjectHeaderInlinedInlineSlotCapacity(maxPathLength)
                        : RoundUpInlineSlotCapacity(maxPathLength);
                if (newInlineSlotCapacity < GetInlineSlotCapacity())
                {
                    rootTypeHandler->ShrinkSlotAndInlineSlotCapacity(newInlineSlotCapacity);
                    shrunk = true;
                }
            }

            if (!shrunk)
            {
                rootTypeHandler->LockInlineSlotCapacity();
            }
        }

#if DBG
        PathTypeHandlerBase * rootTypeHandler = GetRootPathTypeHandler();
        rootTypeHandler->VerifyInlineSlotCapacityIsLocked();
#endif
    }